

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O2

BOOL __thiscall
Js::SimpleTypeHandler<1UL>::IsWritable
          (SimpleTypeHandler<1UL> *this,DynamicObject *instance,PropertyId propertyId)

{
  BOOL BVar1;
  uint uVar2;
  undefined8 in_RAX;
  ushort local_12 [4];
  PropertyIndex index;
  
  local_12[0] = (ushort)((ulong)in_RAX >> 0x30);
  BVar1 = GetDescriptor(this,propertyId,local_12);
  if (BVar1 == 0) {
    uVar2 = 1;
  }
  else {
    uVar2 = this->descriptors[local_12[0]].field_1.Attributes & 4;
  }
  return uVar2;
}

Assistant:

BOOL SimpleTypeHandler<size>::IsWritable(DynamicObject* instance, PropertyId propertyId)
    {
        PropertyIndex index;
        if (!GetDescriptor(propertyId, &index))
        {
            return true;
        }
        return descriptors[index].Attributes & PropertyWritable;
    }